

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidinhibitPolicyMappingTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section11InvalidinhibitPolicyMappingTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_f8 [8];
  PkitsTestInfo info;
  char *crls [5];
  char *pcStack_48;
  char *certs [6];
  Section11InvalidinhibitPolicyMappingTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  certs[3] = "inhibitPolicyMapping5subsubsubCACert";
  certs[4] = "InvalidinhibitPolicyMappingTest5EE";
  certs[1] = "inhibitPolicyMapping5subCACert";
  certs[2] = "inhibitPolicyMapping5subsubCACert";
  pcStack_48 = "TrustAnchorRootCertificate";
  certs[0] = "inhibitPolicyMapping5CACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_f8);
  local_f8 = (undefined1  [8])0x6f63f5;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_f8,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [6])&pcStack_48,
             (char *(*) [5])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_f8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_f8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidinhibitPolicyMappingTest5) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping5CACert",
                               "inhibitPolicyMapping5subCACert",
                               "inhibitPolicyMapping5subsubCACert",
                               "inhibitPolicyMapping5subsubsubCACert",
                               "InvalidinhibitPolicyMappingTest5EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "inhibitPolicyMapping5CACRL",
      "inhibitPolicyMapping5subCACRL", "inhibitPolicyMapping5subsubCACRL",
      "inhibitPolicyMapping5subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.5";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}